

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O3

void cjson_add_raw_should_add_raw(void)

{
  cJSON *object;
  cJSON *pcVar1;
  
  object = (cJSON *)(*global_hooks.allocate)(0x40);
  if (object != (cJSON *)0x0) {
    object->child = (cJSON *)0x0;
    *(undefined8 *)&object->type = 0;
    object->valuedouble = 0.0;
    object->string = (char *)0x0;
    object->valuestring = (char *)0x0;
    *(undefined8 *)&object->valueint = 0;
    object->next = (cJSON *)0x0;
    object->prev = (cJSON *)0x0;
    object->type = 0x40;
  }
  cJSON_AddRawToObject(object,"raw","{}");
  pcVar1 = get_object_item(object,"raw",1);
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x119);
  }
  UnityAssertEqualNumber((long)pcVar1->type,0x80,(char *)0x0,0x11a,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualString(pcVar1->valuestring,"{}",(char *)0x0,0x11b);
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_raw_should_add_raw(void)
{
    cJSON *root = cJSON_CreateObject();
    cJSON *raw = NULL;

    cJSON_AddRawToObject(root, "raw", "{}");

    TEST_ASSERT_NOT_NULL(raw = cJSON_GetObjectItemCaseSensitive(root, "raw"));
    TEST_ASSERT_EQUAL_INT(raw->type, cJSON_Raw);
    TEST_ASSERT_EQUAL_STRING(raw->valuestring, "{}");

    cJSON_Delete(root);
}